

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O1

void Fxu_ListTableDelDivisor(Fxu_Matrix *p,Fxu_Double *pLink)

{
  Fxu_ListDouble *pFVar1;
  Fxu_Double *pFVar2;
  
  pFVar1 = p->pTable + pLink->Key;
  if (pFVar1->pHead == pLink) {
    pFVar1->pHead = pLink->pNext;
  }
  if (pFVar1->pTail == pLink) {
    pFVar1->pTail = pLink->pPrev;
  }
  pFVar2 = pLink->pPrev;
  if (pFVar2 != (Fxu_Double *)0x0) {
    pFVar2->pNext = pLink->pNext;
  }
  if (pLink->pNext != (Fxu_Double *)0x0) {
    pLink->pNext->pPrev = pFVar2;
  }
  pFVar1->nItems = pFVar1->nItems + -1;
  p->nDivs = p->nDivs + -1;
  return;
}

Assistant:

void Fxu_ListTableDelDivisor( Fxu_Matrix * p, Fxu_Double * pLink ) 
{
	Fxu_ListDouble * pList = &(p->pTable[pLink->Key]);
	if ( pList->pHead == pLink )
		 pList->pHead = pLink->pNext;
	if ( pList->pTail == pLink )
		 pList->pTail = pLink->pPrev;
	if ( pLink->pPrev )
		 pLink->pPrev->pNext = pLink->pNext;
	if ( pLink->pNext )
		 pLink->pNext->pPrev = pLink->pPrev;
	pList->nItems--;
    p->nDivs--;
}